

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O3

void __thiscall
QPropertyAnimationPrivate::updateProperty(QPropertyAnimationPrivate *this,QVariant *newValue)

{
  QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
  *data;
  QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
  *this_00;
  QBindingStatus *pQVar1;
  PrivateShared *pPVar2;
  QObject *this_01;
  int iVar3;
  parameter_type pQVar4;
  parameter_type pQVar5;
  char *name;
  long in_FS_OFFSET;
  int flags;
  int status;
  undefined4 local_50;
  undefined4 local_4c;
  QVariant *local_48;
  QVariant *local_40;
  undefined4 *local_38;
  undefined4 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  data = &(this->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.state;
  pQVar1 = (this->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.
           super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar1 != (QBindingStatus *)0x0) &&
     (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper
              (&(this->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.
                super_QObjectPrivate.super_QObjectData.bindingStorage,(QUntypedPropertyData *)data);
  }
  if ((data->super_QPropertyData<QAbstractAnimation::State>).val != Stopped) {
    this_00 = &this->targetObject;
    pQVar4 = QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
             ::value(this_00);
    if (pQVar4 != (parameter_type)0x0) {
      iVar3 = ::QVariant::typeId(newValue);
      if (iVar3 != this->propertyType) {
        QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
        ::value(this_00);
        this_01 = (this->targetObject).super_QPropertyData<QObject_*>.val;
        pQVar5 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                 ::value(&this->propertyName);
        name = (pQVar5->d).ptr;
        if (name == (char *)0x0) {
          name = &QByteArray::_empty;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QObject::setProperty(this_01,name,newValue);
          return;
        }
        goto LAB_003aabd9;
      }
      local_4c = 0xffffffff;
      local_50 = 0;
      local_48 = newValue;
      if (((newValue->d).field_0x18 & 1) != 0) {
        pPVar2 = (newValue->d).data.shared;
        local_48 = (QVariant *)
                   ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                           _q_value.super___atomic_base<int> + (long)pPVar2->offset);
      }
      local_38 = &local_4c;
      local_30 = &local_50;
      local_40 = newValue;
      pQVar4 = QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
               ::value(this_00);
      QMetaObject::metacall(pQVar4,WriteProperty,this->propertyIndex,&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_003aabd9:
  __stack_chk_fail();
}

Assistant:

void QPropertyAnimationPrivate::updateProperty(const QVariant &newValue)
{
    if (state == QAbstractAnimation::Stopped)
        return;

    if (!targetObject)
        return;

    if (newValue.userType() == propertyType) {
        //no conversion is needed, we directly call the QMetaObject::metacall
        //check QMetaProperty::write for an explanation of these
        int status = -1;
        int flags = 0;
        void *argv[] = { const_cast<void *>(newValue.constData()), const_cast<QVariant *>(&newValue), &status, &flags };
        QMetaObject::metacall(targetObject, QMetaObject::WriteProperty, propertyIndex, argv);
    } else {
        targetObject->setProperty(propertyName.value().constData(), newValue);
    }
}